

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ParseSamplers
          (ConversionStream *this,iterator *Token,SamplerHashType *SamplersHash)

{
  TokenListType *pTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  _List_node_base *p_Var4;
  int iVar5;
  string *in_R8;
  bool bVar6;
  string msg;
  string local_98;
  undefined1 local_78;
  String local_70;
  int local_4c;
  _List_node_base **local_48;
  int local_3c;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_38;
  
  iVar5 = *(int *)&Token->_M_node[1]._M_next;
  local_38 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)SamplersHash;
  if (((iVar5 != 0x133) && (iVar5 != 0x135)) &&
     (Token->_M_node !=
      (this->m_Tokens).
      super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
      ._M_impl._M_node.super__List_node_base._M_next)) {
    FormatString<char[26],char[104]>
              (&local_98,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Token->Type == TokenType::OpenParen || Token->Type == TokenType::OpenBrace || Token == m_Tokens.begin()"
               ,(char (*) [104])this);
    DebugAssertionFailed
              (local_98._M_dataplus._M_p,"ParseSamplers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x4b2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  local_3c = *(int *)&Token->_M_node[1]._M_next;
  p_Var4 = Token->_M_node->_M_next;
  Token->_M_node = p_Var4;
  pTVar1 = &this->m_Tokens;
  if (p_Var4 != (_List_node_base *)pTVar1) {
    paVar2 = &local_98.field_2;
    iVar5 = 1;
    do {
      iVar3 = *(int *)&p_Var4[1]._M_next;
      switch(iVar3) {
      case 0x133:
      case 0x135:
        iVar5 = iVar5 + 1;
        break;
      case 0x134:
      case 0x136:
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          iVar5 = 0;
          goto LAB_001efe75;
        }
        break;
      default:
        if (iVar3 != 0x10d) {
          if (iVar5 == 1 && iVar3 == 0x10e) goto LAB_001efba3;
          break;
        }
        if (iVar5 != 1) break;
LAB_001efba3:
        local_48 = &p_Var4[1]._M_prev;
        Token->_M_node = p_Var4->_M_next;
        local_4c = iVar5;
        do {
          if (Token->_M_node == (_List_node_base *)pTVar1) {
            FormatString<char[19],std::__cxx11::string,char[13]>
                      (&local_98,(Diligent *)"Unexpected EOF in ",(char (*) [19])local_48,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x344fc4
                       ,(char (*) [13])in_R8);
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_70,this,Token,4);
            in_R8 = &local_98;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ParseSamplers",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x4dd,&local_98,(char (*) [2])0x33bd33,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != paVar2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
          }
          if (*(int *)&Token->_M_node[1]._M_next != 0x13b) {
            FormatString<char[23],std::__cxx11::string,char[13]>
                      (&local_98,(Diligent *)"Missing identifier in ",(char (*) [23])local_48,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x344fc4
                       ,(char (*) [13])in_R8);
            PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                      (&local_70,this,Token,4);
            in_R8 = &local_98;
            LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                      (false,"ParseSamplers",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                       ,0x4de,&local_98,(char (*) [2])0x33bd33,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != paVar2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
          }
          p_Var4 = Token->_M_node[1]._M_prev;
          local_98._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,p_Var4,
                     (long)&p_Var4->_M_next + (long)Token->_M_node[2]._M_next);
          local_78 = iVar3 == 0x10e;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,bool>>(local_38,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          Token->_M_node = Token->_M_node->_M_next;
          if (local_3c == 0x135) {
LAB_001efe3f:
            bVar6 = false;
          }
          else {
            p_Var4 = Token->_M_node;
            bVar6 = p_Var4 == (_List_node_base *)pTVar1;
            if (bVar6) {
LAB_001efd9b:
              FormatString<char[30],std::__cxx11::string,char[13]>
                        (&local_98,(Diligent *)"Unexpected EOF while parsing ",
                         (char (*) [30])local_48,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x344fc4,(char (*) [13])in_R8);
              PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                        (&local_70,this,Token,4);
              in_R8 = &local_98;
              LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                        (false,"ParseSamplers",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                         ,0x4f8,&local_98,(char (*) [2])0x33bd33,&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != paVar2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              if (((ulong)p_Var4[1]._M_next & 0xfffffffe) != 0x13e) {
                do {
                  p_Var4 = p_Var4->_M_next;
                  bVar6 = p_Var4 == (_List_node_base *)pTVar1;
                  if (bVar6) {
                    Token->_M_node = p_Var4;
                    goto LAB_001efd9b;
                  }
                } while (((ulong)p_Var4[1]._M_next & 0xfffffffe) != 0x13e);
                Token->_M_node = p_Var4;
              }
              if (bVar6) goto LAB_001efd9b;
            }
            if (*(int *)&Token->_M_node[1]._M_next != 0x13f) goto LAB_001efe3f;
            Token->_M_node = Token->_M_node->_M_next;
            bVar6 = true;
          }
          iVar5 = local_4c;
        } while ((bVar6) && (Token->_M_node != (_List_node_base *)pTVar1));
        goto LAB_001efe5a;
      }
      Token->_M_node = p_Var4->_M_next;
LAB_001efe5a:
      p_Var4 = Token->_M_node;
      if ((p_Var4 == (_List_node_base *)pTVar1) || (iVar5 == 0)) goto LAB_001efe75;
    } while( true );
  }
  iVar5 = 1;
LAB_001efe75:
  if ((iVar5 != 0) && (p_Var4 != (_List_node_base *)pTVar1 || iVar5 != 1)) {
    FormatString<char[20]>(&local_98,(char (*) [20])"Error parsing scope");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_70,this,Token,4)
    ;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ParseSamplers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x50d,&local_98,(char (*) [2])0x33bd33,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ParseSamplers(TokenListType::iterator& Token, SamplerHashType& SamplersHash)
{
    VERIFY_EXPR(Token->Type == TokenType::OpenParen || Token->Type == TokenType::OpenBrace || Token == m_Tokens.begin());
    Uint32 ScopeDepth             = 1;
    bool   IsFunctionArgumentList = Token->Type == TokenType::OpenParen;

    // Skip scope start symbol, which is either open bracket or m_Tokens.begin()
    ++Token;
    while (Token != m_Tokens.end() && ScopeDepth > 0)
    {
        if (Token->Type == TokenType::OpenParen ||
            Token->Type == TokenType::OpenBrace)
        {
            // Increase scope depth
            ++ScopeDepth;
            ++Token;
        }
        else if (Token->Type == TokenType::ClosingParen ||
                 Token->Type == TokenType::ClosingBrace)
        {
            // Decrease scope depth
            --ScopeDepth;
            if (ScopeDepth == 0)
                break;
            ++Token;
        }
        else if ((Token->Type == TokenType::kw_SamplerState ||
                  Token->Type == TokenType::kw_SamplerComparisonState) &&
                 // ONLY parse sampler states in the current scope, skip
                 // all nested scopes
                 ScopeDepth == 1)
        {
            const auto& SamplerType   = Token->Literal;
            bool        bIsComparison = Token->Type == TokenType::kw_SamplerComparisonState;
            // SamplerState LinearClamp;
            // ^
            ++Token;

            // There may be a number of samplers declared after single
            // Sampler[Comparison]State keyword:
            // SamplerState Tex2D1_sampler, Tex2D2_sampler;
            do
            {
                // SamplerState LinearClamp;
                //              ^
                VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF in ", SamplerType, " declaration");
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Missing identifier in ", SamplerType, " declaration");
                const auto& SamplerName = Token->Literal;

                // Add sampler state into the hash map
                SamplersHash.insert(std::make_pair(SamplerName, bIsComparison));

                ++Token;
                // SamplerState LinearClamp ;
                //                          ^

                // We cannot just remove sampler declarations, because samplers can
                // be passed to functions as arguments.
                // SamplerState and SamplerComparisonState are #defined as int, so all
                // sampler variables will just be unused global variables or function parameters.
                // Hopefully GLSL compiler will be able to optimize them out.

                if (IsFunctionArgumentList)
                {
                    // In function argument list, every argument
                    // has its own type declaration
                    break;
                }

                // Go to the next sampler declaration or statement end
                while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
                    ++Token;
                VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing ", SamplerType, " declaration");

                if (Token->Type == TokenType::Comma)
                {
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                            ^
                    ++Token;
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                              ^
                }
                else
                {
                    // SamplerState Tex2D1_sampler, Tex2D2_sampler ;
                    //                                             ^
                    break;
                }
            } while (Token != m_Tokens.end());
        }
        else
            ++Token;
    }
    VERIFY_PARSER_STATE(Token, (ScopeDepth == 1 && Token == m_Tokens.end()) || ScopeDepth == 0, "Error parsing scope");
}